

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyBlobInitFromBuf(SyBlob *pBlob,void *pBuffer,sxu32 nSize)

{
  sxu32 nSize_local;
  void *pBuffer_local;
  SyBlob *pBlob_local;
  
  pBlob->pBlob = pBuffer;
  pBlob->mByte = nSize;
  pBlob->nByte = 0;
  pBlob->pAllocator = (SyMemBackend *)0x0;
  pBlob->nFlags = 3;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobInitFromBuf(SyBlob *pBlob, void *pBuffer, sxu32 nSize)
{
#if defined(UNTRUST)
	if( pBlob == 0 || pBuffer == 0 || nSize < 1 ){
		return SXERR_EMPTY;
	}
#endif
	pBlob->pBlob = pBuffer;
	pBlob->mByte = nSize;
	pBlob->nByte = 0;
	pBlob->pAllocator = 0;
	pBlob->nFlags = SXBLOB_LOCKED|SXBLOB_STATIC;
	return SXRET_OK;
}